

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transupp.c
# Opt level: O2

boolean jtransform_request_workspace(j_decompress_ptr srcinfo,jpeg_transform_info *info)

{
  uint uVar1;
  jpeg_error_mgr *pjVar2;
  bool bVar3;
  boolean bVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  j_decompress_ptr pjVar9;
  jvirt_barray_ptr *ppjVar10;
  long lVar11;
  jvirt_barray_ptr pjVar12;
  int MCU_height;
  jpeg_component_info *pjVar13;
  uint uVar14;
  jpeg_component_info *pjVar15;
  JXFORM_CODE transform;
  uint uVar16;
  JDIMENSION JVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  JDIMENSION JVar21;
  bool bVar22;
  int local_38;
  
  if (((info->force_grayscale == 0) || (srcinfo->jpeg_color_space != JCS_YCbCr)) ||
     (srcinfo->num_components != 3)) {
    iVar5 = srcinfo->num_components;
    info->num_components = iVar5;
    bVar22 = iVar5 == 1;
  }
  else {
    info->num_components = 1;
    bVar22 = true;
  }
  JVar21 = srcinfo->image_width;
  JVar17 = srcinfo->image_height;
  srcinfo->output_width = JVar21;
  srcinfo->output_height = JVar17;
  if (info->perfect == 0) {
    transform = info->transform;
  }
  else {
    if (bVar22) {
      iVar5 = srcinfo->min_DCT_scaled_size;
      transform = info->transform;
      MCU_height = iVar5;
    }
    else {
      iVar5 = srcinfo->max_h_samp_factor * srcinfo->min_DCT_scaled_size;
      MCU_height = srcinfo->min_DCT_scaled_size * srcinfo->max_v_samp_factor;
      transform = info->transform;
    }
    bVar4 = jtransform_perfect_transform(JVar21,JVar17,iVar5,MCU_height,transform);
    if (bVar4 == 0) {
      return 0;
    }
  }
  if ((transform < JXFORM_WIPE) && ((0xb8U >> (transform & 0x1f) & 1) != 0)) {
    info->output_width = JVar17;
    info->output_height = JVar21;
    JVar21 = JVar17;
    if (bVar22) {
      iVar5 = srcinfo->min_DCT_scaled_size;
      info->iMCU_sample_width = iVar5;
    }
    else {
      iVar5 = srcinfo->min_DCT_scaled_size;
      info->iMCU_sample_width = srcinfo->max_v_samp_factor * iVar5;
      iVar5 = iVar5 * srcinfo->max_h_samp_factor;
    }
  }
  else {
    info->output_width = JVar21;
    info->output_height = JVar17;
    if (bVar22) {
      iVar5 = srcinfo->min_DCT_scaled_size;
      info->iMCU_sample_width = iVar5;
    }
    else {
      iVar5 = srcinfo->min_DCT_scaled_size;
      info->iMCU_sample_width = srcinfo->max_h_samp_factor * iVar5;
      iVar5 = iVar5 * srcinfo->max_v_samp_factor;
    }
  }
  info->iMCU_sample_height = iVar5;
  if (info->crop == 0) {
    info->x_crop_offset = 0;
    info->y_crop_offset = 0;
    uVar8 = 0;
    bVar22 = true;
  }
  else {
    if (info->crop_xoffset_set == JCROP_UNSET) {
      info->crop_xoffset = 0;
    }
    if (info->crop_yoffset_set == JCROP_UNSET) {
      info->crop_yoffset = 0;
    }
    if (info->crop_width_set == JCROP_UNSET) {
      uVar8 = info->crop_xoffset;
      if (JVar21 <= uVar8) {
        pjVar2 = srcinfo->err;
        pjVar2->msg_code = 0x7c;
        (*pjVar2->error_exit)((j_common_ptr)srcinfo);
        uVar8 = info->crop_xoffset;
        JVar21 = info->output_width;
      }
      info->crop_width = JVar21 - uVar8;
    }
    else {
      uVar8 = info->crop_width;
      if (JVar21 < uVar8) {
        if ((transform != JXFORM_NONE) ||
           (uVar8 <= info->crop_xoffset || uVar8 - JVar21 < info->crop_xoffset)) {
LAB_00107214:
          pjVar2 = srcinfo->err;
          pjVar2->msg_code = 0x7c;
          (*pjVar2->error_exit)((j_common_ptr)srcinfo);
        }
      }
      else if (((JVar21 - uVar8 < info->crop_xoffset) || (uVar8 == 0)) ||
              (JVar21 <= info->crop_xoffset)) goto LAB_00107214;
    }
    uVar8 = info->output_height;
    if (info->crop_height_set == JCROP_UNSET) {
      uVar1 = info->crop_yoffset;
      if (uVar8 <= uVar1) {
        pjVar2 = srcinfo->err;
        pjVar2->msg_code = 0x7c;
        (*pjVar2->error_exit)((j_common_ptr)srcinfo);
        uVar1 = info->crop_yoffset;
        uVar8 = info->output_height;
      }
      info->crop_height = uVar8 - uVar1;
    }
    else {
      uVar1 = info->crop_height;
      if (uVar8 < uVar1) {
        if ((info->transform != JXFORM_NONE) ||
           (uVar1 <= info->crop_yoffset || uVar1 - uVar8 < info->crop_yoffset)) {
LAB_0010728f:
          pjVar2 = srcinfo->err;
          pjVar2->msg_code = 0x7c;
          (*pjVar2->error_exit)((j_common_ptr)srcinfo);
        }
      }
      else if (((uVar8 - uVar1 < info->crop_yoffset) || (uVar1 == 0)) ||
              (uVar8 <= info->crop_yoffset)) goto LAB_0010728f;
    }
    if (info->crop_xoffset_set == JCROP_NEG) {
      uVar8 = info->crop_width;
      uVar1 = info->output_width;
      if (uVar1 < uVar8) {
        JVar21 = uVar8 - (uVar1 + info->crop_xoffset);
      }
      else {
        JVar21 = uVar1 - (uVar8 + info->crop_xoffset);
      }
    }
    else {
      JVar21 = info->crop_xoffset;
    }
    if (info->crop_yoffset_set == JCROP_NEG) {
      uVar8 = info->crop_height;
      uVar1 = info->output_height;
      if (uVar1 < uVar8) {
        JVar17 = uVar8 - (uVar1 + info->crop_yoffset);
      }
      else {
        JVar17 = uVar1 - (uVar8 + info->crop_yoffset);
      }
    }
    else {
      JVar17 = info->crop_yoffset;
    }
    uVar8 = JVar17;
    if (info->transform == JXFORM_WIPE) {
      lVar18 = jdiv_round_up((ulong)(JVar21 % (uint)info->iMCU_sample_width + info->crop_width),
                             (long)info->iMCU_sample_width);
      info->drop_width = (JDIMENSION)lVar18;
      lVar18 = jdiv_round_up((ulong)(JVar17 % (uint)info->iMCU_sample_height + info->crop_height),
                             (long)info->iMCU_sample_height);
      info->drop_height = (JDIMENSION)lVar18;
    }
    else if (info->transform == JXFORM_DROP) {
      uVar8 = info->crop_width;
      uVar1 = info->iMCU_sample_width;
      uVar7 = 0;
      uVar14 = ((JVar21 + uVar1) - 1) % uVar1;
      uVar16 = ~uVar14 + uVar1;
      uVar6 = uVar8 - uVar16;
      if (uVar8 < uVar16 || uVar6 == 0) {
        info->drop_width = 0;
      }
      else {
        if (uVar8 + JVar21 == info->output_width) {
          uVar6 = uVar14 + uVar8;
        }
        uVar7 = uVar6 / uVar1;
        info->drop_width = uVar7;
      }
      JVar21 = JVar21 + uVar16;
      uVar1 = info->crop_height;
      uVar6 = info->iMCU_sample_height;
      uVar14 = ((JVar17 + uVar6) - 1) % uVar6;
      uVar16 = ~uVar14 + uVar6;
      uVar8 = uVar16 + JVar17;
      if (uVar16 < uVar1) {
        uVar16 = -uVar16;
        if (JVar17 + uVar1 == info->output_height) {
          uVar16 = uVar14;
        }
        info->drop_height = (uVar16 + uVar1) / uVar6;
        if ((uVar7 != 0) && (uVar6 <= uVar16 + uVar1)) {
          lVar18 = 0;
          for (lVar19 = 0;
              (lVar19 < info->num_components &&
              (pjVar9 = info->drop_ptr, lVar19 < pjVar9->num_components)); lVar19 = lVar19 + 1) {
            pjVar13 = pjVar9->comp_info;
            pjVar15 = srcinfo->comp_info;
            if (srcinfo->max_h_samp_factor * *(int *)((long)&pjVar13->h_samp_factor + lVar18) !=
                pjVar9->max_h_samp_factor * *(int *)((long)&pjVar15->h_samp_factor + lVar18)) {
              pjVar2 = srcinfo->err;
              pjVar2->msg_code = 0x80;
              (pjVar2->msg_parm).i[0] = (int)lVar19;
              (srcinfo->err->msg_parm).i[1] =
                   *(int *)((long)&info->drop_ptr->comp_info->h_samp_factor + lVar18);
              (srcinfo->err->msg_parm).i[2] = info->drop_ptr->max_h_samp_factor;
              (srcinfo->err->msg_parm).i[3] =
                   *(int *)((long)&srcinfo->comp_info->h_samp_factor + lVar18);
              (srcinfo->err->msg_parm).i[4] = srcinfo->max_h_samp_factor;
              (srcinfo->err->msg_parm).i[5] = 0x68;
              (*srcinfo->err->error_exit)((j_common_ptr)srcinfo);
              pjVar9 = info->drop_ptr;
              pjVar13 = pjVar9->comp_info;
              pjVar15 = srcinfo->comp_info;
            }
            if (srcinfo->max_v_samp_factor * *(int *)((long)&pjVar13->v_samp_factor + lVar18) !=
                pjVar9->max_v_samp_factor * *(int *)((long)&pjVar15->v_samp_factor + lVar18)) {
              pjVar2 = srcinfo->err;
              pjVar2->msg_code = 0x80;
              (pjVar2->msg_parm).i[0] = (int)lVar19;
              (srcinfo->err->msg_parm).i[1] =
                   *(int *)((long)&info->drop_ptr->comp_info->v_samp_factor + lVar18);
              (srcinfo->err->msg_parm).i[2] = info->drop_ptr->max_v_samp_factor;
              (srcinfo->err->msg_parm).i[3] =
                   *(int *)((long)&srcinfo->comp_info->v_samp_factor + lVar18);
              (srcinfo->err->msg_parm).i[4] = srcinfo->max_v_samp_factor;
              (srcinfo->err->msg_parm).i[5] = 0x76;
              (*srcinfo->err->error_exit)((j_common_ptr)srcinfo);
            }
            lVar18 = lVar18 + 0x60;
          }
        }
      }
      else {
        info->drop_height = 0;
      }
    }
    else {
      uVar1 = info->crop_width;
      if ((info->crop_width_set == JCROP_FORCE) || (info->output_width < uVar1)) {
        info->output_width = uVar1;
      }
      else {
        info->output_width = JVar21 % (uint)info->iMCU_sample_width + uVar1;
      }
      uVar1 = info->crop_height;
      if ((info->crop_height_set == JCROP_FORCE) || (info->output_height < uVar1)) {
        info->output_height = uVar1;
      }
      else {
        info->output_height = JVar17 % (uint)info->iMCU_sample_height + uVar1;
      }
    }
    transform = info->transform;
    info->x_crop_offset = JVar21 / (uint)info->iMCU_sample_width;
    uVar8 = uVar8 / (uint)info->iMCU_sample_height;
    info->y_crop_offset = uVar8;
    bVar22 = JVar21 < (uint)info->iMCU_sample_width;
  }
  ppjVar10 = (jvirt_barray_ptr *)0x0;
  switch(transform) {
  case JXFORM_NONE:
    bVar3 = true;
    if (((bool)(bVar22 & uVar8 == 0)) &&
       ((info->output_width <= srcinfo->output_width &&
        (info->output_height <= srcinfo->output_height)))) {
LAB_00107696:
      ppjVar10 = (jvirt_barray_ptr *)0x0;
      goto switchD_001075d0_default;
    }
    break;
  case JXFORM_FLIP_H:
    if (info->trim != 0) {
      trim_right_edge(info,srcinfo->output_width);
      uVar8 = info->y_crop_offset;
    }
    bVar3 = true;
    if ((uVar8 == 0) && (info->slow_hflip == 0)) goto LAB_00107696;
    break;
  case JXFORM_FLIP_V:
    bVar3 = true;
    if (info->trim != 0) {
      JVar21 = srcinfo->output_height;
LAB_001076e8:
      bVar3 = true;
      trim_bottom_edge(info,JVar21);
    }
    break;
  case JXFORM_TRANSPOSE:
    goto switchD_001075d0_caseD_3;
  case JXFORM_TRANSVERSE:
    if (info->trim != 0) {
      trim_right_edge(info,srcinfo->output_height);
      JVar21 = srcinfo->output_width;
LAB_0010765d:
      trim_bottom_edge(info,JVar21);
    }
    goto switchD_001075d0_caseD_3;
  case JXFORM_ROT_90:
    if (info->trim != 0) {
      trim_right_edge(info,srcinfo->output_height);
    }
    goto switchD_001075d0_caseD_3;
  case JXFORM_ROT_180:
    bVar3 = true;
    if (info->trim != 0) {
      trim_right_edge(info,srcinfo->output_width);
      JVar21 = srcinfo->output_height;
      goto LAB_001076e8;
    }
    break;
  case JXFORM_ROT_270:
    if (info->trim != 0) {
      JVar21 = srcinfo->output_width;
      goto LAB_0010765d;
    }
switchD_001075d0_caseD_3:
    bVar3 = false;
    break;
  default:
    goto switchD_001075d0_default;
  }
  ppjVar10 = (jvirt_barray_ptr *)
             (*srcinfo->mem->alloc_small)((j_common_ptr)srcinfo,1,(long)info->num_components << 3);
  lVar19 = jdiv_round_up((ulong)info->output_width,(long)info->iMCU_sample_width);
  lVar11 = jdiv_round_up((ulong)info->output_height,(long)info->iMCU_sample_height);
  lVar18 = 0xc;
  for (lVar20 = 0; lVar20 < info->num_components; lVar20 = lVar20 + 1) {
    JVar21 = 1;
    JVar17 = 1;
    if (info->num_components != 1) {
      pjVar13 = srcinfo->comp_info;
      if (bVar3) {
        JVar21 = *(JDIMENSION *)((long)pjVar13 + lVar18 + -4);
        JVar17 = *(JDIMENSION *)((long)&pjVar13->component_id + lVar18);
      }
      else {
        JVar17 = *(JDIMENSION *)((long)pjVar13 + lVar18 + -4);
        JVar21 = *(JDIMENSION *)((long)&pjVar13->component_id + lVar18);
      }
    }
    local_38 = (int)lVar19;
    pjVar12 = (*srcinfo->mem->request_virt_barray)
                        ((j_common_ptr)srcinfo,1,0,JVar21 * local_38,JVar17 * (int)lVar11,JVar17);
    ppjVar10[lVar20] = pjVar12;
    lVar18 = lVar18 + 0x60;
  }
switchD_001075d0_default:
  info->workspace_coef_arrays = ppjVar10;
  return 1;
}

Assistant:

GLOBAL(boolean)
jtransform_request_workspace(j_decompress_ptr srcinfo,
                             jpeg_transform_info *info)
{
  jvirt_barray_ptr *coef_arrays;
  boolean need_workspace, transpose_it;
  jpeg_component_info *compptr;
  JDIMENSION xoffset, yoffset, dtemp;
  JDIMENSION width_in_iMCUs, height_in_iMCUs;
  JDIMENSION width_in_blocks, height_in_blocks;
  int itemp, ci, h_samp_factor, v_samp_factor;

  /* Determine number of components in output image */
  if (info->force_grayscale &&
      srcinfo->jpeg_color_space == JCS_YCbCr &&
      srcinfo->num_components == 3)
    /* We'll only process the first component */
    info->num_components = 1;
  else
    /* Process all the components */
    info->num_components = srcinfo->num_components;

  /* Compute output image dimensions and related values. */
#if JPEG_LIB_VERSION >= 80
  jpeg_core_output_dimensions(srcinfo);
#else
  srcinfo->output_width = srcinfo->image_width;
  srcinfo->output_height = srcinfo->image_height;
#endif

  /* Return right away if -perfect is given and transformation is not perfect.
   */
  if (info->perfect) {
    if (info->num_components == 1) {
      if (!jtransform_perfect_transform(srcinfo->output_width,
          srcinfo->output_height,
          srcinfo->_min_DCT_h_scaled_size,
          srcinfo->_min_DCT_v_scaled_size,
          info->transform))
        return FALSE;
    } else {
      if (!jtransform_perfect_transform(srcinfo->output_width,
          srcinfo->output_height,
          srcinfo->max_h_samp_factor * srcinfo->_min_DCT_h_scaled_size,
          srcinfo->max_v_samp_factor * srcinfo->_min_DCT_v_scaled_size,
          info->transform))
        return FALSE;
    }
  }

  /* If there is only one output component, force the iMCU size to be 1;
   * else use the source iMCU size.  (This allows us to do the right thing
   * when reducing color to grayscale, and also provides a handy way of
   * cleaning up "funny" grayscale images whose sampling factors are not 1x1.)
   */
  switch (info->transform) {
  case JXFORM_TRANSPOSE:
  case JXFORM_TRANSVERSE:
  case JXFORM_ROT_90:
  case JXFORM_ROT_270:
    info->output_width = srcinfo->output_height;
    info->output_height = srcinfo->output_width;
    if (info->num_components == 1) {
      info->iMCU_sample_width = srcinfo->_min_DCT_v_scaled_size;
      info->iMCU_sample_height = srcinfo->_min_DCT_h_scaled_size;
    } else {
      info->iMCU_sample_width =
        srcinfo->max_v_samp_factor * srcinfo->_min_DCT_v_scaled_size;
      info->iMCU_sample_height =
        srcinfo->max_h_samp_factor * srcinfo->_min_DCT_h_scaled_size;
    }
    break;
  default:
    info->output_width = srcinfo->output_width;
    info->output_height = srcinfo->output_height;
    if (info->num_components == 1) {
      info->iMCU_sample_width = srcinfo->_min_DCT_h_scaled_size;
      info->iMCU_sample_height = srcinfo->_min_DCT_v_scaled_size;
    } else {
      info->iMCU_sample_width =
        srcinfo->max_h_samp_factor * srcinfo->_min_DCT_h_scaled_size;
      info->iMCU_sample_height =
        srcinfo->max_v_samp_factor * srcinfo->_min_DCT_v_scaled_size;
    }
    break;
  }

  /* If cropping has been requested, compute the crop area's position and
   * dimensions, ensuring that its upper left corner falls at an iMCU boundary.
   */
  if (info->crop) {
    /* Insert default values for unset crop parameters */
    if (info->crop_xoffset_set == JCROP_UNSET)
      info->crop_xoffset = 0;   /* default to +0 */
    if (info->crop_yoffset_set == JCROP_UNSET)
      info->crop_yoffset = 0;   /* default to +0 */
    if (info->crop_width_set == JCROP_UNSET) {
      if (info->crop_xoffset >= info->output_width)
        ERREXIT(srcinfo, JERR_BAD_CROP_SPEC);
      info->crop_width = info->output_width - info->crop_xoffset;
    } else {
      /* Check for crop extension */
      if (info->crop_width > info->output_width) {
        /* Crop extension does not work when transforming! */
        if (info->transform != JXFORM_NONE ||
            info->crop_xoffset >= info->crop_width ||
            info->crop_xoffset > info->crop_width - info->output_width)
          ERREXIT(srcinfo, JERR_BAD_CROP_SPEC);
      } else {
        if (info->crop_xoffset >= info->output_width ||
            info->crop_width <= 0 ||
            info->crop_xoffset > info->output_width - info->crop_width)
          ERREXIT(srcinfo, JERR_BAD_CROP_SPEC);
      }
    }
    if (info->crop_height_set == JCROP_UNSET) {
      if (info->crop_yoffset >= info->output_height)
        ERREXIT(srcinfo, JERR_BAD_CROP_SPEC);
      info->crop_height = info->output_height - info->crop_yoffset;
    } else {
      /* Check for crop extension */
      if (info->crop_height > info->output_height) {
        /* Crop extension does not work when transforming! */
        if (info->transform != JXFORM_NONE ||
            info->crop_yoffset >= info->crop_height ||
            info->crop_yoffset > info->crop_height - info->output_height)
          ERREXIT(srcinfo, JERR_BAD_CROP_SPEC);
      } else {
        if (info->crop_yoffset >= info->output_height ||
            info->crop_height <= 0 ||
            info->crop_yoffset > info->output_height - info->crop_height)
          ERREXIT(srcinfo, JERR_BAD_CROP_SPEC);
      }
    }
    /* Convert negative crop offsets into regular offsets */
    if (info->crop_xoffset_set != JCROP_NEG)
      xoffset = info->crop_xoffset;
    else if (info->crop_width > info->output_width) /* crop extension */
      xoffset = info->crop_width - info->output_width - info->crop_xoffset;
    else
      xoffset = info->output_width - info->crop_width - info->crop_xoffset;
    if (info->crop_yoffset_set != JCROP_NEG)
      yoffset = info->crop_yoffset;
    else if (info->crop_height > info->output_height) /* crop extension */
      yoffset = info->crop_height - info->output_height - info->crop_yoffset;
    else
      yoffset = info->output_height - info->crop_height - info->crop_yoffset;
    /* Now adjust so that upper left corner falls at an iMCU boundary */
    switch (info->transform) {
    case JXFORM_DROP:
      /* Ensure the effective drop region will not exceed the requested */
      itemp = info->iMCU_sample_width;
      dtemp = itemp - 1 - ((xoffset + itemp - 1) % itemp);
      xoffset += dtemp;
      if (info->crop_width <= dtemp)
        info->drop_width = 0;
      else if (xoffset + info->crop_width - dtemp == info->output_width)
        /* Matching right edge: include partial iMCU */
        info->drop_width = (info->crop_width - dtemp + itemp - 1) / itemp;
      else
        info->drop_width = (info->crop_width - dtemp) / itemp;
      itemp = info->iMCU_sample_height;
      dtemp = itemp - 1 - ((yoffset + itemp - 1) % itemp);
      yoffset += dtemp;
      if (info->crop_height <= dtemp)
        info->drop_height = 0;
      else if (yoffset + info->crop_height - dtemp == info->output_height)
        /* Matching bottom edge: include partial iMCU */
        info->drop_height = (info->crop_height - dtemp + itemp - 1) / itemp;
      else
        info->drop_height = (info->crop_height - dtemp) / itemp;
      /* Check if sampling factors match for dropping */
      if (info->drop_width != 0 && info->drop_height != 0)
        for (ci = 0; ci < info->num_components &&
                     ci < info->drop_ptr->num_components; ci++) {
          if (info->drop_ptr->comp_info[ci].h_samp_factor *
              srcinfo->max_h_samp_factor !=
              srcinfo->comp_info[ci].h_samp_factor *
              info->drop_ptr->max_h_samp_factor)
            ERREXIT6(srcinfo, JERR_BAD_DROP_SAMPLING, ci,
              info->drop_ptr->comp_info[ci].h_samp_factor,
              info->drop_ptr->max_h_samp_factor,
              srcinfo->comp_info[ci].h_samp_factor,
              srcinfo->max_h_samp_factor, 'h');
          if (info->drop_ptr->comp_info[ci].v_samp_factor *
              srcinfo->max_v_samp_factor !=
              srcinfo->comp_info[ci].v_samp_factor *
              info->drop_ptr->max_v_samp_factor)
            ERREXIT6(srcinfo, JERR_BAD_DROP_SAMPLING, ci,
              info->drop_ptr->comp_info[ci].v_samp_factor,
              info->drop_ptr->max_v_samp_factor,
              srcinfo->comp_info[ci].v_samp_factor,
              srcinfo->max_v_samp_factor, 'v');
        }
      break;
    case JXFORM_WIPE:
      /* Ensure the effective wipe region will cover the requested */
      info->drop_width = (JDIMENSION)jdiv_round_up
        ((long)(info->crop_width + (xoffset % info->iMCU_sample_width)),
         (long)info->iMCU_sample_width);
      info->drop_height = (JDIMENSION)jdiv_round_up
        ((long)(info->crop_height + (yoffset % info->iMCU_sample_height)),
         (long)info->iMCU_sample_height);
      break;
    default:
      /* Ensure the effective crop region will cover the requested */
      if (info->crop_width_set == JCROP_FORCE ||
          info->crop_width > info->output_width)
        info->output_width = info->crop_width;
      else
        info->output_width =
          info->crop_width + (xoffset % info->iMCU_sample_width);
      if (info->crop_height_set == JCROP_FORCE ||
          info->crop_height > info->output_height)
        info->output_height = info->crop_height;
      else
        info->output_height =
          info->crop_height + (yoffset % info->iMCU_sample_height);
    }
    /* Save x/y offsets measured in iMCUs */
    info->x_crop_offset = xoffset / info->iMCU_sample_width;
    info->y_crop_offset = yoffset / info->iMCU_sample_height;
  } else {
    info->x_crop_offset = 0;
    info->y_crop_offset = 0;
  }

  /* Figure out whether we need workspace arrays,
   * and if so whether they are transposed relative to the source.
   */
  need_workspace = FALSE;
  transpose_it = FALSE;
  switch (info->transform) {
  case JXFORM_NONE:
    if (info->x_crop_offset != 0 || info->y_crop_offset != 0 ||
        info->output_width > srcinfo->output_width ||
        info->output_height > srcinfo->output_height)
      need_workspace = TRUE;
    /* No workspace needed if neither cropping nor transforming */
    break;
  case JXFORM_FLIP_H:
    if (info->trim)
      trim_right_edge(info, srcinfo->output_width);
    if (info->y_crop_offset != 0 || info->slow_hflip)
      need_workspace = TRUE;
    /* do_flip_h_no_crop doesn't need a workspace array */
    break;
  case JXFORM_FLIP_V:
    if (info->trim)
      trim_bottom_edge(info, srcinfo->output_height);
    /* Need workspace arrays having same dimensions as source image. */
    need_workspace = TRUE;
    break;
  case JXFORM_TRANSPOSE:
    /* transpose does NOT have to trim anything */
    /* Need workspace arrays having transposed dimensions. */
    need_workspace = TRUE;
    transpose_it = TRUE;
    break;
  case JXFORM_TRANSVERSE:
    if (info->trim) {
      trim_right_edge(info, srcinfo->output_height);
      trim_bottom_edge(info, srcinfo->output_width);
    }
    /* Need workspace arrays having transposed dimensions. */
    need_workspace = TRUE;
    transpose_it = TRUE;
    break;
  case JXFORM_ROT_90:
    if (info->trim)
      trim_right_edge(info, srcinfo->output_height);
    /* Need workspace arrays having transposed dimensions. */
    need_workspace = TRUE;
    transpose_it = TRUE;
    break;
  case JXFORM_ROT_180:
    if (info->trim) {
      trim_right_edge(info, srcinfo->output_width);
      trim_bottom_edge(info, srcinfo->output_height);
    }
    /* Need workspace arrays having same dimensions as source image. */
    need_workspace = TRUE;
    break;
  case JXFORM_ROT_270:
    if (info->trim)
      trim_bottom_edge(info, srcinfo->output_width);
    /* Need workspace arrays having transposed dimensions. */
    need_workspace = TRUE;
    transpose_it = TRUE;
    break;
  case JXFORM_WIPE:
    break;
  case JXFORM_DROP:
    break;
  }

  /* Allocate workspace if needed.
   * Note that we allocate arrays padded out to the next iMCU boundary,
   * so that transform routines need not worry about missing edge blocks.
   */
  if (need_workspace) {
    coef_arrays = (jvirt_barray_ptr *)
      (*srcinfo->mem->alloc_small) ((j_common_ptr)srcinfo, JPOOL_IMAGE,
                sizeof(jvirt_barray_ptr) * info->num_components);
    width_in_iMCUs = (JDIMENSION)
      jdiv_round_up((long)info->output_width, (long)info->iMCU_sample_width);
    height_in_iMCUs = (JDIMENSION)
      jdiv_round_up((long)info->output_height, (long)info->iMCU_sample_height);
    for (ci = 0; ci < info->num_components; ci++) {
      compptr = srcinfo->comp_info + ci;
      if (info->num_components == 1) {
        /* we're going to force samp factors to 1x1 in this case */
        h_samp_factor = v_samp_factor = 1;
      } else if (transpose_it) {
        h_samp_factor = compptr->v_samp_factor;
        v_samp_factor = compptr->h_samp_factor;
      } else {
        h_samp_factor = compptr->h_samp_factor;
        v_samp_factor = compptr->v_samp_factor;
      }
      width_in_blocks = width_in_iMCUs * h_samp_factor;
      height_in_blocks = height_in_iMCUs * v_samp_factor;
      coef_arrays[ci] = (*srcinfo->mem->request_virt_barray)
        ((j_common_ptr)srcinfo, JPOOL_IMAGE, FALSE,
         width_in_blocks, height_in_blocks, (JDIMENSION)v_samp_factor);
    }
    info->workspace_coef_arrays = coef_arrays;
  } else
    info->workspace_coef_arrays = NULL;

  return TRUE;
}